

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls13_both.cc
# Opt level: O3

ssl_private_key_result_t bssl::tls13_add_certificate_verify(SSL_HANDSHAKE *hs)

{
  SSL *ssl;
  Span<const_unsigned_char> in;
  bool bVar1;
  int iVar2;
  int iVar3;
  ssl_private_key_result_t sVar4;
  Array<unsigned_char> msg;
  size_t sig_len;
  uint8_t *sig;
  ScopedCBB cbb;
  CBB child;
  CBB body;
  Array<unsigned_char> local_e8;
  size_t local_d0;
  uint8_t *local_c8;
  uchar *local_c0;
  size_t sStack_b8;
  CBB local_b0;
  CBB local_80;
  CBB local_50;
  
  if (hs->signature_algorithm == 0) {
    __assert_fail("hs->signature_algorithm != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                  ,0x246,
                  "enum ssl_private_key_result_t bssl::tls13_add_certificate_verify(SSL_HANDSHAKE *)"
                 );
  }
  ssl = hs->ssl;
  CBB_zero(&local_b0);
  bVar1 = (*ssl->method->init_message)(ssl,&local_b0,&local_50,'\x0f');
  if (bVar1) {
    iVar2 = CBB_add_u16(&local_50,hs->signature_algorithm);
    if (iVar2 != 0) {
      iVar2 = EVP_PKEY_size((EVP_PKEY *)
                            (((hs->credential)._M_t.
                              super___uniq_ptr_impl<ssl_credential_st,_bssl::internal::Deleter>._M_t
                              .super__Tuple_impl<0UL,_ssl_credential_st_*,_bssl::internal::Deleter>.
                              super__Head_base<0UL,_ssl_credential_st_*,_false>._M_head_impl)->
                            pubkey)._M_t.super___uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>
                           );
      iVar3 = CBB_add_u16_length_prefixed(&local_50,&local_80);
      if (iVar3 != 0) {
        iVar3 = CBB_reserve(&local_80,&local_c8,(long)iVar2);
        if (iVar3 != 0) {
          local_e8.data_ = (uchar *)0x0;
          local_e8.size_ = 0;
          bVar1 = tls13_get_cert_verify_signature_input
                            (hs,&local_e8,~*(uint *)&ssl->field_0xa4 & ssl_cert_verify_client);
          if (bVar1) {
            local_c0 = local_e8.data_;
            sStack_b8 = local_e8.size_;
            in.size_ = local_e8.size_;
            in.data_ = local_e8.data_;
            sVar4 = ssl_private_key_sign
                              (hs,local_c8,&local_d0,(long)iVar2,hs->signature_algorithm,in);
            if (sVar4 == ssl_private_key_success) {
              iVar2 = CBB_did_write(&local_80,local_d0);
              if (iVar2 == 0) {
                sVar4 = ssl_private_key_failure;
              }
              else {
                bVar1 = ssl_add_message_cbb(ssl,&local_b0);
                sVar4 = (uint)!bVar1 * 2;
              }
            }
          }
          else {
            sVar4 = ssl_private_key_failure;
            ssl_send_alert(ssl,2,0x50);
          }
          OPENSSL_free(local_e8.data_);
          goto LAB_00162ccf;
        }
      }
      sVar4 = ssl_private_key_failure;
      ssl_send_alert(ssl,2,0x50);
      goto LAB_00162ccf;
    }
  }
  sVar4 = ssl_private_key_failure;
  ERR_put_error(0x10,0,0x44,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/tls13_both.cc"
                ,0x24c);
LAB_00162ccf:
  CBB_cleanup(&local_b0);
  return sVar4;
}

Assistant:

enum ssl_private_key_result_t tls13_add_certificate_verify(SSL_HANDSHAKE *hs) {
  SSL *const ssl = hs->ssl;
  assert(hs->signature_algorithm != 0);
  ScopedCBB cbb;
  CBB body;
  if (!ssl->method->init_message(ssl, cbb.get(), &body,
                                 SSL3_MT_CERTIFICATE_VERIFY) ||
      !CBB_add_u16(&body, hs->signature_algorithm)) {
    OPENSSL_PUT_ERROR(SSL, ERR_R_INTERNAL_ERROR);
    return ssl_private_key_failure;
  }

  CBB child;
  const size_t max_sig_len = EVP_PKEY_size(hs->credential->pubkey.get());
  uint8_t *sig;
  size_t sig_len;
  if (!CBB_add_u16_length_prefixed(&body, &child) ||
      !CBB_reserve(&child, &sig, max_sig_len)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
    return ssl_private_key_failure;
  }

  Array<uint8_t> msg;
  if (!tls13_get_cert_verify_signature_input(
          hs, &msg,
          ssl->server ? ssl_cert_verify_server : ssl_cert_verify_client)) {
    ssl_send_alert(ssl, SSL3_AL_FATAL, SSL_AD_INTERNAL_ERROR);
    return ssl_private_key_failure;
  }

  enum ssl_private_key_result_t sign_result = ssl_private_key_sign(
      hs, sig, &sig_len, max_sig_len, hs->signature_algorithm, msg);
  if (sign_result != ssl_private_key_success) {
    return sign_result;
  }

  if (!CBB_did_write(&child, sig_len) ||  //
      !ssl_add_message_cbb(ssl, cbb.get())) {
    return ssl_private_key_failure;
  }

  return ssl_private_key_success;
}